

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_formats.c
# Opt level: O1

CMFormat INT_CMregister_format(CManager cm,FMStructDescList format_list)

{
  CMFormat format;
  int iVar1;
  uint uVar2;
  CMFormat format_00;
  size_t sVar3;
  char *pcVar4;
  CMFormat *pp_Var5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  CMFormat local_40;
  
  uVar7 = 0;
  if (cm == (CManager)0x0 || format_list == (FMStructDescList)0x0) {
    format_00 = (CMFormat)0x0;
  }
  else {
    format_00 = (CMFormat)INT_CMmalloc(0x48);
    format_00->cm = cm;
    sVar3 = strlen(format_list->format_name);
    pcVar4 = (char *)INT_CMmalloc(sVar3 + 1);
    format_00->format_name = pcVar4;
    strcpy(pcVar4,format_list->format_name);
    format_00->fmformat = (FMFormat)0x0;
    format_00->format_list_addr = format_list;
    format_00->handler = (CMHandlerFunc)0x0;
    format_00->client_data = (void *)0x0;
    format_00->format_list = format_list;
    format_00->registration_pending = 1;
    iVar1 = 0;
    if (0 < cm->reg_format_count) {
      pcVar4 = format_00->format_name;
      uVar7 = 0;
      uVar8 = 0;
      do {
        format = cm->reg_formats[uVar7];
        iVar1 = strcmp(pcVar4,format->format_name);
        if (iVar1 < 0) {
LAB_00122482:
          uVar8 = uVar7 & 0xffffffff;
          iVar9 = 2;
        }
        else {
          iVar9 = 0;
          if (iVar1 == 0) {
            if (format->registration_pending != 0) {
              CMcomplete_format_registration(format,0);
            }
            if ((format_00->registration_pending == 0) ||
               (CMcomplete_format_registration(format_00,0), format_00->registration_pending == 0))
            {
              uVar2 = FMformat_cmp(format_00->fmformat,cm->reg_formats[uVar7]->fmformat);
              if ((uVar2 & 0xfffffffd) == 1) goto LAB_00122482;
              iVar9 = 0;
              if (uVar2 == 2) {
                uVar8 = uVar7 & 0xffffffff;
              }
            }
            else {
              if (0 < (long)cm->in_format_count) {
                lVar6 = 0;
                do {
                  if (*(FFSTypeHandle *)((long)&cm->in_formats->format + lVar6) ==
                      format_00->ffsformat) {
                    free(format_00->format_name);
                    free(format_00);
                    local_40 = *(CMFormat *)((long)&cm->in_formats->f2_format + lVar6);
                    iVar9 = 1;
                    goto LAB_00122494;
                  }
                  lVar6 = lVar6 + 0x48;
                } while ((long)cm->in_format_count * 0x48 != lVar6);
              }
              puts("Gack, duplicate format, but didn\'t find it");
              local_40 = (CMFormat)0x0;
              iVar9 = 1;
            }
          }
        }
LAB_00122494:
        iVar1 = (int)uVar8;
        if (iVar9 != 0) {
          if (iVar9 != 2) {
            return local_40;
          }
          break;
        }
        uVar7 = uVar7 + 1;
      } while ((long)uVar7 < (long)cm->reg_format_count);
    }
    if ((int)uVar7 == cm->reg_format_count) {
      iVar1 = (int)uVar7;
    }
    pp_Var5 = (CMFormat *)INT_CMrealloc(cm->reg_formats,(long)cm->reg_format_count * 8 + 8);
    cm->reg_formats = pp_Var5;
    iVar9 = cm->reg_format_count;
    lVar6 = (long)iVar9;
    if (iVar1 < iVar9) {
      do {
        cm->reg_formats[lVar6] = cm->reg_formats[lVar6 + -1];
        lVar6 = lVar6 + -1;
      } while (iVar1 < lVar6);
    }
    cm->reg_formats[iVar1] = format_00;
    cm->reg_format_count = iVar9 + 1;
  }
  return format_00;
}

Assistant:

CMFormat
INT_CMregister_format(CManager cm, FMStructDescList format_list)
{
    CMFormat format;

    if ((format_list == NULL) || (cm == NULL)) 
	return NULL;

    format = INT_CMmalloc(sizeof(struct _CMFormat));
    
    format->cm = cm;
    format->format_name = INT_CMmalloc(strlen(format_list[0].format_name) + 1);
    strcpy(format->format_name, format_list[0].format_name);
    format->fmformat = NULL;
    format->format_list_addr = format_list;
    format->handler = (CMHandlerFunc) NULL;
    format->client_data = NULL;
    format->format_list = format_list;
    format->registration_pending = 1;

    format = add_format_to_cm(cm, format);
    return format;
}